

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O1

string * cfd::js::api::json::JsonMappingApi::GetTxDataFromBlock
                   (string *__return_storage_ptr__,string *request_message)

{
  function<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&)> local_48;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  local_28._8_8_ = 0;
  local_28._0_8_ = BlockStructApi::GetTxDataFromBlock;
  local_18._8_8_ =
       std::
       _Function_handler<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&),_cfd::js::api::BlockTxDataStruct_(*)(const_cfd::js::api::BlockTxRequestStruct_&)>
       ::_M_invoke;
  local_18._0_8_ =
       std::
       _Function_handler<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&),_cfd::js::api::BlockTxDataStruct_(*)(const_cfd::js::api::BlockTxRequestStruct_&)>
       ::_M_manager;
  local_48.super__Function_base._M_functor._8_8_ = 0;
  local_48.super__Function_base._M_functor._M_unused._M_function_pointer =
       ElementsBlockStructApi::GetTxDataFromBlock;
  local_48._M_invoker =
       std::
       _Function_handler<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&),_cfd::js::api::BlockTxDataStruct_(*)(const_cfd::js::api::BlockTxRequestStruct_&)>
       ::_M_invoke;
  local_48.super__Function_base._M_manager =
       std::
       _Function_handler<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&),_cfd::js::api::BlockTxDataStruct_(*)(const_cfd::js::api::BlockTxRequestStruct_&)>
       ::_M_manager;
  ExecuteElementsCheckApi<cfd::js::api::json::BlockTxRequest,cfd::js::api::json::BlockTxData,cfd::js::api::BlockTxRequestStruct,cfd::js::api::BlockTxDataStruct>
            (__return_storage_ptr__,(json *)request_message,(string *)local_28,&local_48,
             (function<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&)>
              *)ElementsBlockStructApi::GetTxDataFromBlock);
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)
              ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  if ((code *)local_18._0_8_ != (code *)0x0) {
    (*(code *)local_18._0_8_)(local_28,local_28,3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JsonMappingApi::GetTxDataFromBlock(
    const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::BlockTxRequest, api::json::BlockTxData,
      api::BlockTxRequestStruct, api::BlockTxDataStruct>(
      request_message, BlockStructApi::GetTxDataFromBlock,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsBlockStructApi::GetTxDataFromBlock);
#else
      BlockStructApi::GetTxDataFromBlock);
#endif
}